

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

int sort_cmp(void *a,void *b)

{
  char *__s;
  char *__s_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  __s = *(char **)((long)a + 8);
  pcVar2 = strchr(__s,0x2f);
  __s_00 = *(char **)((long)b + 8);
  pcVar3 = strchr(__s_00,0x2f);
  iVar1 = -1;
  if ((pcVar3 != (char *)0x0 || pcVar2 == (char *)0x0) &&
     (iVar1 = 1, pcVar2 != (char *)0x0 || pcVar3 == (char *)0x0)) {
    iVar1 = strcmp(__s,__s_00);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int sort_cmp(const void *a, const void *b)
{
	const file_sorted_t *sort1 = (const file_sorted_t *)a;
	const file_sorted_t *sort2 = (const file_sorted_t *)b;
	int in_dir1, in_dir2;

	in_dir1 = (strchr(sort1->path_in_zip, '/') != NULL);
	in_dir2 = (strchr(sort2->path_in_zip, '/') != NULL);
	if (in_dir1 == 1 && in_dir2 == 0)
	{
		return -1;
	}
	if (in_dir1 == 0 && in_dir2 == 1)
	{
		return 1;
	}
	return strcmp(((const file_sorted_t *)a)->path_in_zip,
		((const file_sorted_t *)b)->path_in_zip);
}